

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS ref_gather_create(REF_GATHER *ref_gather_ptr)

{
  REF_STATUS RVar1;
  REF_GATHER pRVar2;
  
  pRVar2 = (REF_GATHER)malloc(0x30);
  *ref_gather_ptr = pRVar2;
  if (pRVar2 == (REF_GATHER)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x29,
           "ref_gather_create","malloc *ref_gather_ptr of REF_GATHER_STRUCT NULL");
    RVar1 = 2;
  }
  else {
    pRVar2->recording = 0;
    pRVar2->grid_file = (FILE *)0x0;
    pRVar2->hist_file = (FILE *)0x0;
    *(undefined8 *)((long)&pRVar2->hist_file + 4) = 0;
    *(undefined8 *)((long)&pRVar2->time + 4) = 0;
    pRVar2->min_quality = 0.1;
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_gather_create(REF_GATHER *ref_gather_ptr) {
  REF_GATHER ref_gather;

  ref_malloc(*ref_gather_ptr, 1, REF_GATHER_STRUCT);

  ref_gather = *ref_gather_ptr;

  ref_gather->recording = REF_FALSE;
  ref_gather->grid_file = (FILE *)NULL;
  ref_gather->hist_file = (FILE *)NULL;
  ref_gather->time = 0.0;

  ref_gather->low_quality_zone = REF_FALSE;
  ref_gather->min_quality = 0.1;

  return REF_SUCCESS;
}